

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::RALocalAllocator::allocBranch
          (RALocalAllocator *this,InstNode *node,RABlock *target,RABlock *cont)

{
  Error EVar1;
  BaseNode *pBVar2;
  RAAssignment *this_00;
  uint *puVar3;
  long in_RDX;
  RALocalAllocator *in_RSI;
  ZoneVector<asmjit::v1_14::RASharedAssignment> *in_RDI;
  Error _err_5;
  Error _err_4;
  Label savedTarget;
  Label trampoline;
  Operand *targetOp;
  BaseNode *curCursor;
  Error _err_3;
  BaseNode *prevCursor;
  BaseNode *injectionPoint;
  Error _err_2;
  Error _err_1;
  Error _err;
  InstNode *in_stack_000002e0;
  RALocalAllocator *in_stack_000002e8;
  RAAssignment *in_stack_fffffffffffffdd8;
  RAAssignment *other;
  RAAssignment *in_stack_fffffffffffffde0;
  ZoneVector<asmjit::v1_14::RASharedAssignment> *this_01;
  long lVar4;
  RALocalAllocator *in_stack_fffffffffffffdf8;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  Operand *local_1c8;
  BaseNode *local_1c0;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  RABlock *in_stack_fffffffffffffe50;
  RABlock *in_stack_fffffffffffffe58;
  BaseNode *node_00;
  uint in_stack_fffffffffffffe60;
  Error local_16c;
  BaseRAPass *pBVar5;
  undefined2 uVar6;
  ZoneBitVector *liveIn;
  PhysToWorkMap *in_stack_fffffffffffffed8;
  PhysToWorkMap *dstPhysToWorkMap;
  RALocalAllocator *this_02;
  
  liveIn = *(ZoneBitVector **)(in_RDI + 8);
  pBVar5 = in_RSI->_pass;
  *(BaseRAPass **)(liveIn + 0x198) = pBVar5;
  this_02 = in_RSI;
  if (*(long *)(in_RDX + 200) != 0) {
    in_stack_fffffffffffffdf8 = *(RALocalAllocator **)(in_RDX + 200);
    Support::test<asmjit::v1_14::RABlockFlags,asmjit::v1_14::RABlockFlags>
              (*(RABlockFlags *)(in_RDX + 0xc),kIsAllocated);
    EVar1 = switchToAssignment(this_02,in_stack_fffffffffffffed8,liveIn,
                               SUB81((ulong)pBVar5 >> 0x38,0),SUB81((ulong)pBVar5 >> 0x30,0));
    if (EVar1 != 0) {
      return EVar1;
    }
  }
  uVar6 = (undefined2)((ulong)pBVar5 >> 0x30);
  local_16c = allocInst(in_stack_000002e8,in_stack_000002e0);
  if (local_16c == 0) {
    this_01 = in_RDI;
    lVar4 = in_RDX;
    if (*(int *)(in_RDX + 0xb8) != -1) {
      ZoneVector<asmjit::v1_14::RASharedAssignment>::operator[]
                (in_RDI,(size_t)in_stack_fffffffffffffde0);
    }
    local_16c = spillScratchGpRegsBeforeEntry
                          (in_stack_fffffffffffffdf8,(RegMask)((ulong)lVar4 >> 0x20));
    if (local_16c == 0) {
      if (*(long *)(in_RDX + 200) == 0) {
        EVar1 = BaseRAPass::setBlockEntryAssignment
                          ((BaseRAPass *)(ulong)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                           in_stack_fffffffffffffe50,
                           (RAAssignment *)
                           CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        if (EVar1 != 0) {
          return EVar1;
        }
      }
      else {
        dstPhysToWorkMap = *(PhysToWorkMap **)(*(long *)in_RDI + 0xa8);
        node_00 = *(BaseNode **)(dstPhysToWorkMap->assigned)._masks._data;
        pBVar2 = BaseBuilder::setCursor(*(BaseBuilder **)(in_RDI + 8),node_00);
        RAAssignment::copyFrom(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        other = *(RAAssignment **)(in_RDX + 200);
        this_00 = (RAAssignment *)(in_RDX + 0x78);
        Support::test<asmjit::v1_14::RABlockFlags,asmjit::v1_14::RABlockFlags>
                  (*(RABlockFlags *)(in_RDX + 0xc),kIsAllocated);
        EVar1 = switchToAssignment(this_02,dstPhysToWorkMap,liveIn,SUB21((ushort)uVar6 >> 8,0),
                                   SUB21(uVar6,0));
        if (EVar1 != 0) {
          return EVar1;
        }
        local_1c0 = *(BaseNode **)(*(long *)(in_RDI + 8) + 0x198);
        if (local_1c0 != node_00) {
          local_1c8 = InstNode::op((InstNode *)this_01,(uint32_t)((ulong)this_00 >> 0x20));
          if (((local_1c8->super_Operand_)._signature._bits & 7) != 5) {
            EVar1 = DebugUtils::errored(3);
            return EVar1;
          }
          (**(code **)(**(long **)(in_RDI + 8) + 0x20))(&local_1d8);
          local_1e8._0_4_ = (local_1c8->super_Operand_)._signature;
          local_1e8._4_4_ = (local_1c8->super_Operand_)._baseId;
          local_1e0 = *(undefined8 *)(local_1c8->super_Operand_)._data;
          (local_1c8->super_Operand_)._signature = (Signature)(undefined4)local_1d8;
          (local_1c8->super_Operand_)._baseId = local_1d8._4_4_;
          *(undefined8 *)(local_1c8->super_Operand_)._data = local_1d0;
          puVar3 = (in_RSI->_clobberedRegs)._masks._data + 3;
          *puVar3 = *puVar3 & 0xffffffef;
          EVar1 = (**(code **)(**(long **)in_RDI + 0x68))(*(long **)in_RDI,&local_1e8);
          if (EVar1 != 0) {
            return EVar1;
          }
          *(BaseNode **)(*(long *)(in_RDI + 8) + 0x198) = node_00;
          (**(code **)(**(long **)(in_RDI + 8) + 0x30))(*(long **)(in_RDI + 8),&local_1d8);
        }
        *(BaseNode **)(*(long *)(in_RDI + 8) + 0x198) = pBVar2;
        RAAssignment::swap(this_00,other);
      }
      local_16c = 0;
    }
  }
  return local_16c;
}

Assistant:

Error RALocalAllocator::allocBranch(InstNode* node, RABlock* target, RABlock* cont) noexcept {
  // TODO: This should be used to make the branch allocation better.
  DebugUtils::unused(cont);

  // The cursor must point to the previous instruction for a possible instruction insertion.
  _cc->_setCursor(node->prev());

  // Use TryMode of `switchToAssignment()` if possible.
  if (target->hasEntryAssignment()) {
    ASMJIT_PROPAGATE(switchToAssignment(target->entryPhysToWorkMap(), target->liveIn(), target->isAllocated(), true));
  }

  ASMJIT_PROPAGATE(allocInst(node));
  ASMJIT_PROPAGATE(spillRegsBeforeEntry(target));

  if (target->hasEntryAssignment()) {
    BaseNode* injectionPoint = _pass->extraBlock()->prev();
    BaseNode* prevCursor = _cc->setCursor(injectionPoint);

    _tmpAssignment.copyFrom(_curAssignment);
    ASMJIT_PROPAGATE(switchToAssignment(target->entryPhysToWorkMap(), target->liveIn(), target->isAllocated(), false));

    BaseNode* curCursor = _cc->cursor();
    if (curCursor != injectionPoint) {
      // Additional instructions emitted to switch from the current state to the `target` state. This means
      // that we have to move these instructions into an independent code block and patch the jump location.
      Operand& targetOp = node->op(node->opCount() - 1);
      if (ASMJIT_UNLIKELY(!targetOp.isLabel())) {
        return DebugUtils::errored(kErrorInvalidState);
      }

      Label trampoline = _cc->newLabel();
      Label savedTarget = targetOp.as<Label>();

      // Patch `target` to point to the `trampoline` we just created.
      targetOp = trampoline;

      // Clear a possible SHORT form as we have no clue now if the SHORT form would be encodable after patching
      // the target to `trampoline` (X86 specific).
      node->clearOptions(InstOptions::kShortForm);

      // Finalize the switch assignment sequence.
      ASMJIT_PROPAGATE(_pass->emitJump(savedTarget));
      _cc->_setCursor(injectionPoint);
      _cc->bind(trampoline);
    }

    _cc->_setCursor(prevCursor);
    _curAssignment.swap(_tmpAssignment);
  }
  else {
    ASMJIT_PROPAGATE(_pass->setBlockEntryAssignment(target, block(), _curAssignment));
  }

  return kErrorOk;
}